

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O1

Vec_Int_t * Sdb_StoFindInputs(Vec_Wec_t *vCuts,int Front)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *p;
  int *piVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  undefined4 *__s;
  long lVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int i;
  uint uVar9;
  int iVar10;
  int iVar11;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar3 = (int *)malloc(400);
  p->pArray = piVar3;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_01->pArray = piVar3;
  if ((long)vCuts->nSize < 1) {
    uVar5 = 0;
  }
  else {
    lVar4 = 0;
    uVar5 = 0;
    do {
      lVar6 = (long)vCuts->pArray[lVar4].nSize;
      if (0 < lVar6) {
        lVar8 = 0;
        do {
          uVar9 = vCuts->pArray[lVar4].pArray[lVar8];
          if ((int)uVar5 <= (int)uVar9) {
            uVar5 = uVar9;
          }
          lVar8 = lVar8 + 1;
        } while (lVar6 != lVar8);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != vCuts->nSize);
  }
  uVar9 = uVar5 + 1;
  uVar7 = 0x10;
  if (0xe < uVar5) {
    uVar7 = (ulong)uVar9;
  }
  __s = (undefined4 *)malloc(uVar7 << 2);
  if (__s != (undefined4 *)0x0) {
    memset(__s,0,(ulong)uVar9 << 2);
  }
  iVar10 = vCuts->nSize;
  if (0 < (long)iVar10) {
    pVVar2 = vCuts->pArray;
    lVar4 = 0;
    do {
      if (0 < pVVar2[lVar4].nSize) {
        piVar3 = pVVar2[lVar4].pArray;
        lVar6 = 0;
        do {
          iVar1 = piVar3[lVar6];
          if (((long)iVar1 < 0) || ((int)uVar5 < iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          __s[iVar1] = __s[iVar1] + 1;
          lVar6 = lVar6 + 1;
        } while (lVar6 < pVVar2[lVar4].nSize);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != iVar10);
  }
  *__s = 0;
  iVar10 = 1000000000;
  uVar7 = 0;
  do {
    iVar1 = __s[uVar7];
    iVar11 = iVar1;
    if (iVar10 < iVar1) {
      iVar11 = iVar10;
    }
    if (iVar1 == 0) {
      iVar11 = iVar10;
    }
    iVar10 = iVar11;
    uVar7 = uVar7 + 1;
  } while (uVar9 != uVar7);
  if (iVar10 != 1000000000) {
    uVar7 = 0;
    do {
      if (__s[uVar7] == iVar10) goto LAB_0067bce1;
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
    uVar7 = 0xffffffff;
LAB_0067bce1:
    Vec_IntPush(p_00,(uint)uVar7);
    if (uVar5 < (uint)uVar7) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    __s[uVar7 & 0xffffffff] = 0;
    uVar7 = 0;
    uVar9 = 0;
    if (0 < (int)uVar5) {
      uVar9 = uVar5;
    }
    do {
      if ((__s[uVar7] == iVar10) || (__s[uVar7] == iVar10 * 2)) {
        Vec_IntPush(p_00,(int)uVar7);
        __s[uVar7] = 0;
      }
      uVar7 = uVar7 + 1;
    } while (uVar9 + 1 != uVar7);
    if (uVar5 < (uint)Front) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar10 = __s[(uint)Front];
    Vec_IntPush(p_01,Front);
    __s[(uint)Front] = 0;
    uVar7 = 0;
    do {
      if (__s[uVar7] == iVar10 * 2 || __s[uVar7] == iVar10) {
        Vec_IntPush(p_01,(int)uVar7);
        __s[uVar7] = 0;
      }
      uVar7 = uVar7 + 1;
    } while (uVar9 + 1 != uVar7);
    free(__s);
    uVar5 = p_00->nSize;
    lVar4 = (long)(int)uVar5;
    printf("Vector has %d entries: {",(ulong)uVar5);
    if (0 < lVar4) {
      piVar3 = p_00->pArray;
      lVar6 = 0;
      do {
        printf(" %d",(ulong)(uint)piVar3[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar4 != lVar6);
    }
    puts(" }");
    uVar9 = p_01->nSize;
    lVar6 = (long)(int)uVar9;
    printf("Vector has %d entries: {",(ulong)uVar9);
    if (0 < lVar6) {
      piVar3 = p_01->pArray;
      lVar8 = 0;
      do {
        printf(" %d",(ulong)(uint)piVar3[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar6 != lVar8);
    }
    puts(" }");
    if (0 < (int)uVar5) {
      piVar3 = p_00->pArray;
      lVar8 = 0;
      do {
        Vec_IntPush(p,piVar3[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar4 != lVar8);
    }
    if (0 < (int)uVar9) {
      piVar3 = p_01->pArray;
      lVar4 = 0;
      do {
        Vec_IntPush(p,piVar3[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar6 != lVar4);
    }
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    if (p_01->pArray != (int *)0x0) {
      free(p_01->pArray);
      p_01->pArray = (int *)0x0;
    }
    free(p_01);
  }
  return p;
}

Assistant:

Vec_Int_t * Sdb_StoFindInputs( Vec_Wec_t * vCuts, int Front )
{
    int fVerbose = 0;
    Vec_Int_t * vCut, * vCounts;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Vec_Int_t * vResA = Vec_IntAlloc( 100 );
    Vec_Int_t * vResB = Vec_IntAlloc( 100 );
    int i, k, Entry, Max = 0, Min, MinValue;
    // find MAX value
    Vec_WecForEachLevel( vCuts, vCut, i )
        Vec_IntForEachEntry( vCut, Entry, k )
            Max = Abc_MaxInt( Max, Entry );
    // count how many times each value appears
    vCounts = Vec_IntStart( Max + 1 );
    Vec_WecForEachLevel( vCuts, vCut, i )
        Vec_IntForEachEntry( vCut, Entry, k )
            Vec_IntAddToEntry( vCounts, Entry, 1 );
    Vec_IntWriteEntry( vCounts, 0, 0 );
    // print out
    if ( fVerbose )
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry )
            printf( "%5d %5d\n", k, Entry );
    // collect first part
    MinValue = ABC_INFINITY;
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry )
            MinValue = Abc_MinInt( MinValue, Entry );
    if ( MinValue == ABC_INFINITY )
        return vRes;
    Min = Vec_IntFind( vCounts, MinValue );
    Vec_IntPush( vResA, Min );
    Vec_IntWriteEntry( vCounts, Min, 0 );
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry == MinValue || Entry == 2*MinValue )
        {
            Vec_IntPush( vResA, k );
            Vec_IntWriteEntry( vCounts, k, 0 );
        }
    // collect second parts
    MinValue = Vec_IntEntry( vCounts, Front );
    Min = Front;
    Vec_IntPush( vResB, Min );
    Vec_IntWriteEntry( vCounts, Min, 0 );
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry == MinValue || Entry == 2*MinValue )
        {
            Vec_IntPush( vResB, k );
            Vec_IntWriteEntry( vCounts, k, 0 );
        }
    Vec_IntFree( vCounts );
    Vec_IntPrint( vResA );
    Vec_IntPrint( vResB );
    // here we need to order the inputs

    // append
    Vec_IntAppend( vRes, vResA );
    Vec_IntAppend( vRes, vResB );
    Vec_IntFree( vResA );
    Vec_IntFree( vResB );
    return vRes;
}